

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.h
# Opt level: O2

bool __thiscall MiniScript::Value::operator==(Value *this,Value *rhs)

{
  StringStorage *lhs;
  StringStorage *rhs_00;
  SeqElemStorage *lhs_00;
  SeqElemStorage *rhs_01;
  bool bVar1;
  Value *this_00;
  Value VStack_38;
  Value local_28;
  
  this_00 = &VStack_38;
  if (this->type == rhs->type) {
    bVar1 = true;
    switch(this->type) {
    case Null:
      goto switchD_0010d158_caseD_0;
    case Number:
      return (bool)(-((rhs->data).number == (this->data).number) & 1);
    case Temp:
      return (this->data).tempNum == (rhs->data).tempNum;
    case String:
    case Var:
      lhs = (StringStorage *)(this->data).ref;
      rhs_00 = (StringStorage *)(rhs->data).ref;
      if (lhs == rhs_00) {
        return true;
      }
      if (rhs_00 != (StringStorage *)0x0 && lhs != (StringStorage *)0x0) {
        bVar1 = Equal(lhs,rhs_00);
        return bVar1;
      }
      break;
    case List:
      if ((this->data).ref == (rhs->data).ref) {
        return true;
      }
      if ((rhs->data).ref != (RefCountedStorage *)0x0 &&
          (this->data).ref != (RefCountedStorage *)0x0) {
        Value(&local_28,rhs);
        bVar1 = RecursiveEqual(this,&local_28);
        this_00 = &local_28;
LAB_0010d26f:
        ~Value(this_00);
        return bVar1;
      }
      break;
    case Map:
      if ((this->data).ref == (rhs->data).ref) {
        return true;
      }
      if ((rhs->data).ref != (RefCountedStorage *)0x0 &&
          (this->data).ref != (RefCountedStorage *)0x0) {
        Value(&VStack_38,rhs);
        bVar1 = RecursiveEqual(this,&VStack_38);
        goto LAB_0010d26f;
      }
      break;
    case Function:
    case Handle:
      return (this->data).ref == (rhs->data).ref;
    case SeqElem:
      lhs_00 = (SeqElemStorage *)(this->data).ref;
      rhs_01 = (SeqElemStorage *)(rhs->data).ref;
      if (lhs_00 == rhs_01) {
        return true;
      }
      if (rhs_01 != (SeqElemStorage *)0x0 && lhs_00 != (SeqElemStorage *)0x0) {
        bVar1 = Equal(lhs_00,rhs_01);
        return bVar1;
      }
    }
  }
  bVar1 = false;
switchD_0010d158_caseD_0:
  return bVar1;
}

Assistant:

inline bool Value::operator==(const Value& rhs) const {
		if (type != rhs.type) return false;
		switch (type) {
			case ValueType::Null:
				return true;		// null values are always equal
				
			case ValueType::Number:
				return data.number == rhs.data.number;
				
			case ValueType::String:
			case ValueType::Var:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return Equal((StringStorage*)data.ref, (StringStorage*)rhs.data.ref);
			}
			case ValueType::List:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return RecursiveEqual(rhs);
			}
			case ValueType::Map:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return RecursiveEqual(rhs);
			}
			case ValueType::Function:
				// Two functions are equal only if they refer to the exact same function
				return (data.ref == rhs.data.ref);

			case ValueType::Temp:
				return (data.tempNum == rhs.data.tempNum);
				
			case ValueType::SeqElem:
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return Equal((SeqElemStorage*)data.ref, (SeqElemStorage*)rhs.data.ref);
			
			case ValueType::Handle:
				return (data.ref == rhs.data.ref);
		}
		return false;
	}